

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Trigger * triggersReallyExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  byte bVar1;
  Trigger *pTVar2;
  int iVar3;
  uint uVar4;
  u8 uVar5;
  Trigger *pTVar6;
  char *pcVar7;
  Trigger *pTVar8;
  uint uVar9;
  bool bVar10;
  Trigger *local_50;
  
  local_50 = sqlite3TriggerList(pParse,pTab);
  if (local_50 == (Trigger *)0x0) {
LAB_001b1c11:
    uVar9 = 0;
    local_50 = (Trigger *)0x0;
  }
  else {
    if (((pParse->db->flags & 0x40000) == 0) && (pTVar8 = pTab->pTrigger, pTVar8 != (Trigger *)0x0))
    {
      pTVar2 = local_50;
      if (local_50 == pTVar8) goto LAB_001b1c11;
      do {
        pTVar6 = pTVar2;
        pTVar2 = pTVar6->pNext;
        if (pTVar2 == (Trigger *)0x0) break;
      } while (pTVar2 != pTVar8);
      pTVar6->pNext = (Trigger *)0x0;
    }
    pcVar7 = "UPDATE";
    if (op == 0x80) {
      pcVar7 = "DELETE";
    }
    uVar9 = 0;
    pTVar8 = local_50;
    do {
      bVar1 = pTVar8->op;
      if (((uint)bVar1 == op) && (iVar3 = checkColumnOverlap(pTVar8->pColumns,pChanges), iVar3 != 0)
         ) {
LAB_001b1b8c:
        uVar4 = (uint)pTVar8->tr_tm;
LAB_001b1bfa:
        uVar9 = uVar9 | uVar4;
      }
      else {
        if (bVar1 == 0x96) {
          pTVar8->op = (u8)op;
          bVar10 = pTab->eTabType != '\x01';
          if (op == 0x7f || bVar10) {
            uVar5 = bVar10 + '\x01';
            uVar4 = bVar10 + 1;
          }
          else {
            sqlite3ErrorMsg(pParse,"%s RETURNING is not available on virtual tables",pcVar7);
            uVar5 = '\x01';
            uVar4 = 1;
          }
          pTVar8->tr_tm = uVar5;
          goto LAB_001b1bfa;
        }
        if ((((pTVar8->bReturning != '\0') && (op == 0x81)) && (bVar1 == 0x7f)) &&
           (pParse->pToplevel == (Parse *)0x0)) goto LAB_001b1b8c;
      }
      pTVar8 = pTVar8->pNext;
    } while (pTVar8 != (Trigger *)0x0);
  }
  if (pMask != (int *)0x0) {
    *pMask = uVar9;
  }
  if (uVar9 == 0) {
    local_50 = (Trigger *)0x0;
  }
  return local_50;
}

Assistant:

static SQLITE_NOINLINE Trigger *triggersReallyExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  int mask = 0;
  Trigger *pList = 0;
  Trigger *p;

  pList = sqlite3TriggerList(pParse, pTab);
  assert( pList==0 || IsVirtual(pTab)==0
           || (pList->bReturning && pList->pNext==0) );
  if( pList!=0 ){
    p = pList;
    if( (pParse->db->flags & SQLITE_EnableTrigger)==0
     && pTab->pTrigger!=0
    ){
      /* The SQLITE_DBCONFIG_ENABLE_TRIGGER setting is off.  That means that
      ** only TEMP triggers are allowed.  Truncate the pList so that it
      ** includes only TEMP triggers */
      if( pList==pTab->pTrigger ){
        pList = 0;
        goto exit_triggers_exist;
      }
      while( ALWAYS(p->pNext) && p->pNext!=pTab->pTrigger ) p = p->pNext;
      p->pNext = 0;
      p = pList;
    }
    do{
      if( p->op==op && checkColumnOverlap(p->pColumns, pChanges) ){
        mask |= p->tr_tm;
      }else if( p->op==TK_RETURNING ){
        /* The first time a RETURNING trigger is seen, the "op" value tells
        ** us what time of trigger it should be. */
        assert( sqlite3IsToplevel(pParse) );
        p->op = op;
        if( IsVirtual(pTab) ){
          if( op!=TK_INSERT ){
            sqlite3ErrorMsg(pParse,
              "%s RETURNING is not available on virtual tables",
              op==TK_DELETE ? "DELETE" : "UPDATE");
          }
          p->tr_tm = TRIGGER_BEFORE;
        }else{
          p->tr_tm = TRIGGER_AFTER;
        }
        mask |= p->tr_tm;
      }else if( p->bReturning && p->op==TK_INSERT && op==TK_UPDATE
                && sqlite3IsToplevel(pParse) ){
        /* Also fire a RETURNING trigger for an UPSERT */
        mask |= p->tr_tm;
      }
      p = p->pNext;
    }while( p );
  }
exit_triggers_exist:
  if( pMask ){
    *pMask = mask;
  }
  return (mask ? pList : 0);
}